

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O1

int __thiscall
asl::Dic<asl::Dic<asl::String>_>::clone
          (Dic<asl::Dic<asl::String>_> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  Dic<asl::Dic<asl::String>_> b;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> local_10;
  
  local_10._a = *(KeyVal **)__fn;
  LOCK();
  *(int *)&local_10._a[-1].value.super_Map<asl::String,_asl::String>.a._a =
       *(int *)&local_10._a[-1].value.super_Map<asl::String,_asl::String>.a._a + 1;
  UNLOCK();
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::dup(&local_10,(int)__fn);
  (this->super_Map<asl::String,_asl::Dic<asl::String>_>).a._a = local_10._a;
  LOCK();
  *(int *)&local_10._a[-1].value.super_Map<asl::String,_asl::String>.a._a =
       *(int *)&local_10._a[-1].value.super_Map<asl::String,_asl::String>.a._a + 1;
  UNLOCK();
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::~Array(&local_10);
  return (int)this;
}

Assistant:

Dic& dup() {this->a.dup(); return *this;}